

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase812::run(TestCase812 *this)

{
  Reader reader;
  Builder builder_00;
  PointerType PVar1;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  Builder root;
  Builder child;
  MallocMessageBuilder builder;
  StructBuilder in_stack_000002d0;
  OrphanBuilder local_200;
  OrphanBuilder local_1e0;
  StructBuilder local_1c0;
  StructBuilder local_198;
  StructBuilder local_168;
  SegmentReader *in_stack_fffffffffffffec0;
  CapTableReader *in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffed0;
  WirePointer *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 uStack_118;
  PointerBuilder local_110;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0,FIXED_SIZE);
  MessageBuilder::getRootInternal((Builder *)&local_1e0,&local_f8.super_MessageBuilder);
  local_198.data = local_1e0.capTable;
  local_198.segment = (SegmentBuilder *)local_1e0.tag.content;
  local_198.capTable = (CapTableBuilder *)local_1e0.segment;
  PointerBuilder::initStruct(&local_1c0,(PointerBuilder *)&local_198,(StructSize)0x140006);
  local_1e0.capTable = (CapTableBuilder *)(local_1c0.pointers + 2);
  local_1e0.tag.content = (uint64_t)local_1c0.segment;
  local_1e0.segment = (SegmentBuilder *)local_1c0.capTable;
  PointerBuilder::initStruct(&local_198,(PointerBuilder *)&local_1e0,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffec8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffec0;
  builder_00._builder.data = in_stack_fffffffffffffed0;
  builder_00._builder.pointers = in_stack_fffffffffffffed8;
  builder_00._builder.dataSize = (StructDataBitCount)in_stack_fffffffffffffee0;
  builder_00._builder.pointerCount = SUB82(in_stack_fffffffffffffee0,4);
  builder_00._builder._38_2_ = SUB82(in_stack_fffffffffffffee0,6);
  initTestMessage(builder_00);
  local_110.pointer = local_1c0.pointers + 2;
  local_110.segment = local_1c0.segment;
  local_110.capTable = local_1c0.capTable;
  PointerBuilder::disown(&local_1e0,&local_110);
  local_200.capTable = local_1e0.capTable;
  local_200.location = local_1e0.location;
  local_200.tag.content = local_1e0.tag.content;
  local_200.segment = local_1e0.segment;
  local_1e0.capTable = (CapTableBuilder *)(local_1c0.pointers + 2);
  local_1e0.tag.content = (uint64_t)local_1c0.segment;
  local_1e0.segment = (SegmentBuilder *)local_1c0.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_1e0);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x333,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
               (char (*) [42])"failed: expected !(root.hasStructField())");
  }
  if ((local_200.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x334,ERROR,"\"failed: expected \" \"orphan != nullptr\"",
               (char (*) [35])"failed: expected orphan != nullptr");
  }
  if ((local_200.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x335,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
               (char (*) [38])"failed: expected !(orphan == nullptr)");
  }
  OrphanBuilder::asStructReader
            ((StructReader *)&stack0xfffffffffffffec0,&local_200,(StructSize)0x140006);
  reader._reader.capTable = in_stack_fffffffffffffec8;
  reader._reader.segment = in_stack_fffffffffffffec0;
  reader._reader.data = in_stack_fffffffffffffed0;
  reader._reader.pointers = in_stack_fffffffffffffed8;
  reader._reader.dataSize = (StructDataBitCount)in_stack_fffffffffffffee0;
  reader._reader.pointerCount = SUB82(in_stack_fffffffffffffee0,4);
  reader._reader._38_2_ = SUB82(in_stack_fffffffffffffee0,6);
  reader._reader._40_8_ = uStack_118;
  checkTestMessage(reader);
  OrphanBuilder::asStruct(&local_168,&local_200,(StructSize)0x140006);
  checkTestMessage((Builder)in_stack_000002d0);
  if (local_200.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_200);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Orphans, FarPointer) {
  MallocMessageBuilder builder(0, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<TestAllTypes>();
  auto child = root.initStructField();
  initTestMessage(child);

  auto orphan = root.disownStructField();
  EXPECT_FALSE(root.hasStructField());
  EXPECT_TRUE(orphan != nullptr);
  EXPECT_FALSE(orphan == nullptr);

  checkTestMessage(orphan.getReader());
  checkTestMessage(orphan.get());
}